

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O3

int f_close(lua_State *L)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  void *pvVar2;
  lua_CFunction cf;
  
  tofile(L);
  pvVar2 = luaL_checkudata(L,1,"FILE*");
  UNRECOVERED_JUMPTABLE = *(code **)((long)pvVar2 + 8);
  *(undefined8 *)((long)pvVar2 + 8) = 0;
  iVar1 = (*UNRECOVERED_JUMPTABLE)(L);
  return iVar1;
}

Assistant:

static int f_close (lua_State *L) {
  tofile(L);  /* make sure argument is an open stream */
  return aux_close(L);
}